

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_encode_tiles_row_mt(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  MACROBLOCKD *xd_00;
  AV1LfSync *lf_sync;
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int *piVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  _Bool _Var7;
  uint8_t uVar8;
  uint uVar9;
  uint num_workers;
  SequenceHeader *pSVar10;
  EncWorkerData *pEVar11;
  LFWorkerData *pLVar12;
  ENTROPY_CONTEXT *pEVar13;
  AVxWorker *pAVar14;
  MB_MODE_INFO *pMVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  AV1LfMTInfo *pAVar20;
  AVxWorkerInterface *pAVar21;
  byte bVar22;
  int mib_size_log2;
  int lf_id;
  int iVar23;
  int i;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  byte bVar28;
  long lVar29;
  AVxWorker *pAVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  aom_internal_error_info *paVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  TileDataEnc *pTVar38;
  size_t __n;
  uint uVar39;
  int iVar40;
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  MACROBLOCKD *xd;
  aom_internal_error_info error_info;
  long local_240;
  aom_internal_error_info local_1d0;
  
  uVar9 = (cpi->common).tiles.cols;
  iVar36 = (cpi->common).mi_params.mi_rows;
  bVar28 = (byte)((cpi->common).seq_params)->mib_size_log2;
  iVar23 = (1 << (bVar28 & 0x1f)) + iVar36 + -1 >> (bVar28 & 0x1f);
  iVar19 = (cpi->common).tiles.rows;
  lVar37 = (long)iVar19;
  iVar40 = 0;
  uVar41 = 0;
  if (0 < lVar37) {
    lVar26 = 0;
    uVar41 = 0;
    do {
      piVar4 = (cpi->common).tiles.row_start_sb + lVar26;
      iVar32 = (cpi->common).tiles.row_start_sb[lVar26 + 1] << (bVar28 & 0x1f);
      lVar26 = lVar26 + 1;
      if (iVar36 <= iVar32) {
        iVar32 = iVar36;
      }
      uVar39 = (~(-1 << (bVar28 & 0x1f)) - (*piVar4 << (bVar28 & 0x1f))) + iVar32 >> (bVar28 & 0x1f)
      ;
      uVar33 = (ulong)uVar39;
      if ((int)uVar39 < (int)uVar41) {
        uVar33 = uVar41;
      }
      uVar41 = uVar33;
    } while (lVar37 != lVar26);
  }
  lVar26 = (long)(cpi->common).tiles.cols;
  if (0 < lVar26) {
    iVar36 = (cpi->common).mi_params.mi_cols;
    lVar29 = 0;
    iVar40 = 0;
    do {
      piVar4 = (cpi->common).tiles.col_start_sb + lVar29;
      iVar32 = (cpi->common).tiles.col_start_sb[lVar29 + 1] << (bVar28 & 0x1f);
      lVar29 = lVar29 + 1;
      if (iVar36 <= iVar32) {
        iVar32 = iVar36;
      }
      iVar32 = (~(-1 << (bVar28 & 0x1f)) - (*piVar4 << (bVar28 & 0x1f))) + iVar32 >> (bVar28 & 0x1f)
      ;
      if (iVar40 <= iVar32) {
        iVar40 = iVar32;
      }
    } while (lVar26 != lVar29);
  }
  bVar42 = true;
  if (((((cpi->mt_info).enc_row_mt.allocated_tile_cols == uVar9) &&
       ((cpi->mt_info).enc_row_mt.allocated_tile_rows == iVar19)) &&
      ((cpi->mt_info).enc_row_mt.allocated_rows == (int)uVar41)) &&
     ((cpi->mt_info).enc_row_mt.allocated_cols == iVar40 + -1)) {
    bVar42 = (cpi->mt_info).enc_row_mt.allocated_sb_rows != iVar23;
  }
  uVar39 = (cpi->mt_info).num_mod_workers[4];
  if (cpi->allocated_tiles < (int)(uVar9 * iVar19)) {
    av1_alloc_tile_data(cpi);
  }
  if (bVar42) {
    row_mt_mem_alloc(cpi,(int)uVar41,iVar40,(uint)(cpi->oxcf).algo_cfg.cdf_update_mode);
  }
  num_workers = (cpi->mt_info).num_workers;
  if ((int)uVar39 < (int)num_workers) {
    num_workers = uVar39;
  }
  uVar33 = (ulong)num_workers;
  _Var7 = (cpi->common).features.coded_lossless;
  bVar43 = true;
  bVar42 = true;
  if (_Var7 == false) {
    bVar42 = (cpi->common).tiles.large_scale != 0;
  }
  pSVar10 = (cpi->common).seq_params;
  if (pSVar10->enable_cdef != '\0' && _Var7 == false) {
    bVar43 = (cpi->common).tiles.large_scale != 0;
  }
  if ((pSVar10->enable_restoration == '\0') || ((cpi->common).features.all_lossless != false)) {
    bVar44 = false;
  }
  else {
    bVar44 = (cpi->common).tiles.large_scale == 0;
  }
  iVar36 = (cpi->ppi->rtc_ref).non_reference_frame;
  if (iVar36 == 0) {
    bVar28 = 1;
    if ((cpi->oxcf).algo_cfg.skip_postproc_filtering == true) {
      bVar28 = bVar44 | (cpi->common).width != (cpi->common).superres_upscaled_width |
               cpi->ppi->b_calculate_psnr != 0;
      if (bVar43 || bVar28 != 0) {
        bVar28 = bVar28 | bVar42;
      }
      else {
        bVar28 = (cpi->sf).lpf_sf.cdef_pick_method != CDEF_PICK_FROM_Q | bVar42;
      }
    }
  }
  else {
    bVar28 = 0;
  }
  if ((((cpi->oxcf).mode == '\x01') && (4 < (cpi->oxcf).speed)) &&
     ((cpi->sf).lpf_sf.lpf_pick == '\x03')) {
    bVar22 = 0;
    if ((iVar36 == 0) && ((cpi->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY)) {
      bVar22 = ((cpi->common).features.allow_intrabc ^ 1U) & bVar28;
    }
  }
  else {
    bVar22 = 0;
  }
  cm = &cpi->common;
  piVar4 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id;
  xd_00 = &(cpi->td).mb.e_mbd;
  (cpi->mt_info).pipeline_lpf_mt_with_enc = (uint)bVar22;
  if (bVar22 == 0) goto LAB_001c1f92;
  (cpi->common).lf.filter_level[0] = 0;
  (cpi->common).lf.filter_level[1] = 0;
  (cpi->common).lf.backup_filter_level[0] = 0;
  (cpi->common).lf.backup_filter_level[1] = 0;
  (cpi->common).cdef_info.cdef_bits = 0;
  (cpi->common).cdef_info.nb_cdef_strengths = 1;
  (cpi->common).cdef_info.cdef_strengths[0] = 0;
  (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
  (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
  (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
  (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
  if (bVar42 != false) goto LAB_001c1f92;
  av1_pick_filter_level(cpi->source,cpi,(cpi->sf).lpf_sf.lpf_pick);
  uVar8 = ((cpi->common).seq_params)->monochrome;
  if ((cpi->mt_info).pipeline_lpf_mt_with_enc == 0) goto LAB_001c1f92;
  if ((cpi->common).lf.filter_level[0] == 0) {
    if ((cpi->common).lf.filter_level[1] == 0) goto LAB_001c1f92;
    if ((cpi->common).lf.filter_level[1] != 0) goto LAB_001c1ca7;
    local_1d0.error_code = AOM_CODEC_OK;
  }
  else {
LAB_001c1ca7:
    local_1d0.error_code = AOM_CODEC_ERROR;
  }
  uVar5 = (cpi->common).lf.filter_level_u;
  uVar6 = (cpi->common).lf.filter_level_v;
  local_1d0._4_8_ =
       ~CONCAT44(-(uint)(uVar6 == 0),-(uint)(uVar5 == 0)) &
       (ulong)CONCAT14(uVar8 == '\0',(uint)(uVar8 == '\0')) & (ulong)DAT_004db550;
  iVar36 = 0;
  if ((0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect) &&
     (iVar36 = 0, 0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr)) {
    iVar36 = ((cpi->sf).lpf_sf.lpf_pick == '\x03') + 1;
  }
  iVar40 = (cpi->common).mi_params.mi_rows;
  av1_loop_filter_frame_init(cm,0,(uint)(uVar8 == '\0') * 2 + 1);
  bVar28 = (byte)((cpi->common).seq_params)->mib_size_log2;
  iVar35 = 1 << (bVar28 & 0x1f);
  bVar28 = bVar28 & 0x1f;
  iVar24 = iVar35 + (cpi->common).mi_params.mi_rows + -1 >> bVar28;
  iVar32 = (cpi->mt_info).num_mod_workers[5];
  lf_sync = &(cpi->mt_info).lf_row_sync;
  if ((((cpi->mt_info).lf_row_sync.sync_range == 0) || (iVar24 != (cpi->mt_info).lf_row_sync.rows))
     || ((cpi->mt_info).lf_row_sync.num_workers < iVar32)) {
    av1_loop_filter_dealloc(lf_sync);
    av1_loop_filter_alloc(lf_sync,cm,iVar24,(cpi->common).width,iVar32);
  }
  (cpi->mt_info).lf_row_sync.lf_mt_exit = false;
  uVar25 = (ulong)(uint)(0 >> bVar28);
  do {
    memset((cpi->mt_info).lf_row_sync.cur_sb_col[uVar25],0xff,(long)iVar24 << 2);
    uVar25 = uVar25 + 1;
  } while (uVar25 != 3);
  pAVar20 = (cpi->mt_info).lf_row_sync.job_queue;
  (cpi->mt_info).lf_row_sync.jobs_enqueued = 0;
  (cpi->mt_info).lf_row_sync.jobs_dequeued = 0;
  iVar32 = 0;
  do {
    if (0 < iVar40) {
      iVar24 = 0;
      do {
        lVar26 = 0;
        lVar29 = 0;
        do {
          iVar31 = (int)lVar29;
          if (iVar36 != 2) {
LAB_001c1e30:
            paVar34 = (aom_internal_error_info *)(local_1d0.detail + lVar26 + -8);
            goto LAB_001c1e38;
          }
          if (iVar31 != 2) {
            if (iVar31 == 1) {
              paVar34 = (aom_internal_error_info *)local_1d0.detail;
              if (local_1d0.has_detail == 0) goto LAB_001c1e38;
            }
            else {
              paVar34 = &local_1d0;
              if (iVar31 != 0) goto LAB_001c1e30;
LAB_001c1e38:
              if (paVar34->error_code == AOM_CODEC_OK) goto LAB_001c1e5d;
            }
            if (*(int *)(local_1d0.detail + lVar29 * 4 + -8) != 0) {
              pAVar20->mi_row = iVar24;
              pAVar20->plane = iVar31;
              pAVar20->dir = iVar32;
              pAVar20->lpf_opt_level = iVar36;
              pAVar20 = pAVar20 + 1;
              piVar1 = &(cpi->mt_info).lf_row_sync.jobs_enqueued;
              *piVar1 = *piVar1 + 1;
            }
          }
LAB_001c1e5d:
          lVar29 = lVar29 + 1;
          lVar26 = lVar26 + 4;
        } while (lVar29 != 3);
        iVar24 = iVar24 + iVar35;
      } while (iVar24 < iVar40);
    }
    bVar42 = iVar32 == 0;
    iVar32 = iVar32 + 1;
  } while (bVar42);
  if (0 < (int)num_workers) {
    lVar26 = uVar33 * 0x2268 + -0x2248;
    uVar25 = uVar33;
    do {
      uVar27 = uVar25 - 1;
      pEVar11 = (cpi->mt_info).tile_thr_data;
      pEVar11[uVar27].lf_sync = lf_sync;
      pLVar12 = (cpi->mt_info).lf_row_sync.lfdata;
      pEVar11[uVar27].lf_data = pLVar12 + uVar27;
      pLVar12[uVar27].frame_buffer = &((cpi->common).cur_frame)->buf;
      pLVar12[uVar27].cm = cm;
      pLVar12[uVar27].xd = xd_00;
      lVar29 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(cpi->td).mb.e_mbd.plane[0].pre[-1].buf + lVar29);
        uVar16 = *puVar2;
        uVar17 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(cpi->td).mb.e_mbd.plane[0].pre[-1].width + lVar29);
        uVar18 = puVar2[1];
        puVar3 = (undefined8 *)((long)pLVar12->planes[0].pre + lVar29 + lVar26 + -0x30);
        *puVar3 = *puVar2;
        puVar3[1] = uVar18;
        puVar2 = (undefined8 *)((long)(pLVar12->planes[0].pre + -2) + lVar29 + lVar26);
        *puVar2 = uVar16;
        puVar2[1] = uVar17;
        *(undefined8 *)((long)pLVar12->planes[0].pre + lVar29 + lVar26 + -0x4c) =
             *(undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar29 + -0x2c);
        lVar29 = lVar29 + 0xa30;
      } while (lVar29 != 0x1e90);
      lVar26 = lVar26 + -0x2268;
      bVar42 = 1 < (long)uVar25;
      uVar25 = uVar27;
    } while (bVar42);
  }
LAB_001c1f92:
  av1_init_tile_data(cpi);
  memset(piVar4,0xff,0x100);
  memset((cpi->mt_info).enc_row_mt.num_tile_cols_done,0,(long)iVar23 << 2);
  (cpi->mt_info).enc_row_mt.row_mt_exit = false;
  if (0 < iVar19) {
    lVar26 = 0;
    local_240 = 0;
    do {
      uVar25 = (ulong)uVar9;
      lVar29 = lVar26;
      if (0 < (int)uVar9) {
        do {
          pTVar38 = cpi->tile_data;
          memset(*(void **)((long)&(pTVar38->row_mt_sync).num_finished_cols + lVar29),0xff,
                 uVar41 << 2);
          *(undefined4 *)((long)&(pTVar38->row_mt_sync).next_mi_row + lVar29) =
               *(undefined4 *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x2e + lVar29);
          *(undefined4 *)((long)&(pTVar38->row_mt_sync).num_threads_working + lVar29) = 0;
          iVar36 = av1_get_intrabc_extra_top_right_sb_delay(cm);
          *(int *)((long)&(pTVar38->row_mt_sync).intrabc_extra_top_right_sb_delay + lVar29) = iVar36
          ;
          av1_inter_mode_data_init
                    ((TileDataEnc *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x2e + lVar29));
          iVar36 = *(int *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x36 + lVar29);
          pSVar10 = (cpi->common).seq_params;
          uVar27 = -1L << ((byte)pSVar10->mib_size_log2 & 0x3f);
          bVar28 = (byte)pSVar10->subsampling_x;
          uVar27 = (long)(int)(~(uint)uVar27 +
                              (*(int *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x3a + lVar29) -
                              iVar36)) & uVar27;
          iVar40 = iVar36 >> (bVar28 & 0x1f);
          uVar8 = pSVar10->monochrome;
          memset((cpi->common).above_contexts.entropy[0][local_240] + iVar36,0,uVar27);
          if (uVar8 == '\0') {
            pEVar13 = (cpi->common).above_contexts.entropy[1][local_240];
            if ((pEVar13 == (ENTROPY_CONTEXT *)0x0) ||
               ((cpi->common).above_contexts.entropy[2][local_240] == (ENTROPY_CONTEXT *)0x0)) {
              aom_internal_error((cpi->td).mb.e_mbd.error_info,AOM_CODEC_CORRUPT_FRAME,
                                 "Invalid value of planes");
            }
            else {
              __n = (size_t)((int)uVar27 >> (bVar28 & 0x1f));
              memset(pEVar13 + iVar40,0,__n);
              memset((cpi->common).above_contexts.entropy[2][local_240] + iVar40,0,__n);
            }
          }
          memset((cpi->common).above_contexts.partition[local_240] + iVar36,0,uVar27);
          memset((cpi->common).above_contexts.txfm[local_240] + iVar36,0x40,uVar27);
          lVar29 = lVar29 + 0x5d10;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      local_240 = local_240 + 1;
      lVar26 = lVar26 + (ulong)uVar9 * 0x5d10;
    } while (local_240 != lVar37);
  }
  if (0 < (int)num_workers) {
    uVar41 = 0;
    iVar36 = 0;
    do {
      piVar4[uVar41] = iVar36;
      iVar36 = iVar36 + 1;
      if (iVar36 == uVar9 * iVar19) {
        iVar36 = 0;
      }
      uVar41 = uVar41 + 1;
    } while (uVar33 != uVar41);
  }
  prepare_enc_workers(cpi,enc_row_mt_worker_hook,num_workers);
  pAVar21 = aom_get_worker_interface();
  if (0 < (int)num_workers) {
    lVar26 = uVar33 + 1;
    lVar37 = uVar33 * 0x38;
    do {
      pAVar30 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar30[-1].had_error + lVar37) = 0;
      pAVar30 = (AVxWorker *)((long)&pAVar30[-1].impl_ + lVar37);
      if (lVar26 == 2) {
        (*pAVar21->execute)(pAVar30);
      }
      else {
        (*pAVar21->launch)(pAVar30);
      }
      lVar26 = lVar26 + -1;
      lVar37 = lVar37 + -0x38;
    } while (1 < lVar26);
  }
  pAVar21 = aom_get_worker_interface();
  pAVar30 = (cpi->mt_info).workers;
  iVar36 = pAVar30->had_error;
  if (iVar36 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar30->data1 + 0x18),0x1a0);
  }
  if (1 < (int)num_workers) {
    lVar26 = uVar33 + 1;
    lVar37 = uVar33 * 0x38;
    do {
      pAVar14 = (cpi->mt_info).workers;
      iVar19 = (*pAVar21->sync)((AVxWorker *)((long)&pAVar14[-1].impl_ + lVar37));
      if (iVar19 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar14[-1].data1 + lVar37) + 0x18),0x1a0);
        iVar36 = 1;
      }
      lVar26 = lVar26 + -1;
      lVar37 = lVar37 + -0x38;
    } while (2 < lVar26);
  }
  if (iVar36 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar30->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (((cpi->common).delta_q_info.delta_lf_present_flag != 0) && (0 < (cpi->common).tiles.rows)) {
    pSVar10 = (cpi->common).seq_params;
    iVar36 = pSVar10->mib_size;
    uVar41 = (ulong)((uint)(pSVar10->monochrome == '\0') * 2 + 2);
    iVar19 = 0;
    do {
      iVar40 = (cpi->common).tiles.cols;
      if (0 < iVar40) {
        iVar23 = 0;
        do {
          pTVar38 = cpi->tile_data;
          iVar32 = iVar40 * iVar19 + iVar23;
          iVar40 = pTVar38[iVar32].tile_info.mi_row_start;
          if (iVar40 < pTVar38[iVar32].tile_info.mi_row_end) {
            pTVar38 = pTVar38 + iVar32;
            do {
              if (iVar40 == (pTVar38->tile_info).mi_row_start) {
                av1_reset_loop_filter_delta
                          (xd_00,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
              }
              for (iVar32 = (pTVar38->tile_info).mi_col_start;
                  iVar32 < (pTVar38->tile_info).mi_col_end; iVar32 = iVar32 + iVar36) {
                pMVar15 = (cpi->common).mi_params.mi_grid_base
                          [(cpi->common).mi_params.mi_stride * iVar40 + iVar32];
                if ((pMVar15->skip_txfm == '\x01') &&
                   (pMVar15->bsize == ((cpi->common).seq_params)->sb_size)) {
                  uVar33 = 0;
                  do {
                    pMVar15->delta_lf[uVar33] = (cpi->td).mb.e_mbd.delta_lf[uVar33];
                    uVar33 = uVar33 + 1;
                  } while (uVar41 != uVar33);
                  pMVar15->delta_lf_from_base = (cpi->td).mb.e_mbd.delta_lf_from_base;
                }
                else if ((cpi->common).delta_q_info.delta_lf_multi == 0) {
                  (cpi->td).mb.e_mbd.delta_lf_from_base = pMVar15->delta_lf_from_base;
                }
                else {
                  uVar33 = 0;
                  do {
                    (cpi->td).mb.e_mbd.delta_lf[uVar33] = pMVar15->delta_lf[uVar33];
                    uVar33 = uVar33 + 1;
                  } while (uVar41 != uVar33);
                }
              }
              iVar40 = iVar40 + iVar36;
            } while (iVar40 < (pTVar38->tile_info).mi_row_end);
          }
          iVar23 = iVar23 + 1;
          iVar40 = (cpi->common).tiles.cols;
        } while (iVar23 < iVar40);
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < (cpi->common).tiles.rows);
  }
  accumulate_counters_enc_workers(cpi,num_workers);
  return;
}

Assistant:

void av1_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int sb_rows_in_frame = get_sb_rows_in_frame(cm);
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int max_sb_rows_in_tile = 0, max_sb_cols_in_tile = 0;
  int num_workers = mt_info->num_mod_workers[MOD_ENC];

  compute_max_sb_rows_cols(cm, &max_sb_rows_in_tile, &max_sb_cols_in_tile);
  const bool alloc_row_mt_mem =
      (enc_row_mt->allocated_tile_cols != tile_cols ||
       enc_row_mt->allocated_tile_rows != tile_rows ||
       enc_row_mt->allocated_rows != max_sb_rows_in_tile ||
       enc_row_mt->allocated_cols != (max_sb_cols_in_tile - 1) ||
       enc_row_mt->allocated_sb_rows != sb_rows_in_frame);
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_sb_rows_in_tile, max_sb_cols_in_tile,
                     cpi->oxcf.algo_cfg.cdf_update_mode);
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  lpf_pipeline_mt_init(cpi, num_workers);

  av1_init_tile_data(cpi);

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  memset(enc_row_mt->num_tile_cols_done, 0,
         sizeof(*enc_row_mt->num_tile_cols_done) * sb_rows_in_frame);
  enc_row_mt->row_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_sb_rows_in_tile);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;
      row_mt_sync->intrabc_extra_top_right_sb_delay =
          av1_get_intrabc_extra_top_right_sb_delay(cm);

      av1_inter_mode_data_init(this_tile);
      av1_zero_above_context(cm, &cpi->td.mb.e_mbd,
                             this_tile->tile_info.mi_col_start,
                             this_tile->tile_info.mi_col_end, tile_row);
    }
  }

  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  prepare_enc_workers(cpi, enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  if (cm->delta_q_info.delta_lf_present_flag) update_delta_lf_for_row_mt(cpi);
  accumulate_counters_enc_workers(cpi, num_workers);
}